

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O2

If_LibBox_t * If_LibBoxRead(char *pFileName)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int nPis;
  int nPos;
  FILE *__stream;
  char *pcVar4;
  If_LibBox_t *p;
  char *pcVar5;
  If_Box_t *pBox;
  ulong uVar6;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar4 = "Cannot open file \"%s\".\n";
  }
  else {
    pcVar4 = If_LibBoxGetToken((FILE *)__stream);
    if (pcVar4 != (char *)0x0) {
      if (*pcVar4 == '.') {
        fclose(__stream);
        puts("Wrong box format. Please try \"read_box -e\".");
        return (If_LibBox_t *)0x0;
      }
      p = If_LibBoxStart();
      while (pcVar4 != (char *)0x0) {
        pcVar4 = Abc_UtilStrsav(pcVar4);
        pcVar5 = If_LibBoxGetToken((FILE *)__stream);
        iVar2 = atoi(pcVar5);
        pcVar5 = If_LibBoxGetToken((FILE *)__stream);
        iVar3 = atoi(pcVar5);
        pcVar5 = If_LibBoxGetToken((FILE *)__stream);
        nPis = atoi(pcVar5);
        pcVar5 = If_LibBoxGetToken((FILE *)__stream);
        nPos = atoi(pcVar5);
        pBox = If_BoxStart(pcVar4,iVar2,nPis,nPos,0,(uint)(iVar3 == 0),0);
        If_LibBoxAdd(p,pBox);
        uVar1 = nPos * nPis;
        if (nPos * nPis < 1) {
          uVar1 = 0;
        }
        for (uVar6 = 0; pcVar4 = If_LibBoxGetToken((FILE *)__stream), uVar1 != uVar6;
            uVar6 = uVar6 + 1) {
          iVar2 = -1000000000;
          if (*pcVar4 != '-') {
            iVar2 = atoi(pcVar4);
          }
          pBox->pDelays[uVar6] = iVar2;
        }
      }
      fclose(__stream);
      return p;
    }
    fclose(__stream);
    pcVar4 = "Cannot read library name from file \"%s\".\n";
  }
  printf(pcVar4,pFileName);
  return (If_LibBox_t *)0x0;
}

Assistant:

If_LibBox_t * If_LibBoxRead( char * pFileName )
{
    FILE * pFile;
    If_LibBox_t * p;
    If_Box_t * pBox;
    char * pToken, * pName;
    int i, Id, fBlack, nPis, nPos;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    // get the library name
    pToken = If_LibBoxGetToken( pFile );
    if ( pToken == NULL )
    {
        fclose( pFile );
        printf( "Cannot read library name from file \"%s\".\n", pFileName );
        return NULL;
    }
    if ( pToken[0] == '.' )    
    {
        fclose( pFile );
        printf( "Wrong box format. Please try \"read_box -e\".\n" );
        return NULL;
    }
       
    // create library
    p = If_LibBoxStart();
    while ( pToken )
    {
        // save name
        pName  = Abc_UtilStrsav(pToken);
        // save ID
        pToken = If_LibBoxGetToken( pFile );
        Id     = atoi( pToken );
        // save white/black
        pToken = If_LibBoxGetToken( pFile );
        fBlack = !atoi( pToken );
        // save PIs
        pToken = If_LibBoxGetToken( pFile );
        nPis   = atoi( pToken );
        // save POs
        pToken = If_LibBoxGetToken( pFile );
        nPos   = atoi( pToken );
        // create box
        pBox   = If_BoxStart( pName, Id, nPis, nPos, 0, fBlack, 0 );
        If_LibBoxAdd( p, pBox );
        // read the table
        for ( i = 0; i < nPis * nPos; i++ )
        {
            pToken = If_LibBoxGetToken( pFile );
            pBox->pDelays[i] = (pToken[0] == '-') ? -ABC_INFINITY : atoi(pToken);
        }
        // extract next name
        pToken = If_LibBoxGetToken( pFile );
    }
    fclose( pFile );
    return p;
}